

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O2

hwaddr riscv_cpu_get_phys_page_debug_riscv64(CPUState *cs,vaddr addr)

{
  _Bool two_stage;
  int iVar1;
  int iVar2;
  hwaddr hVar3;
  int prot;
  hwaddr phys_addr;
  
  iVar2 = *(int *)(cs[1].tb_jmp_cache + 0x18d);
  if (((ulong)cs[1].tb_jmp_cache[0x18a] & 0x80) == 0) {
    two_stage = false;
  }
  else {
    two_stage = (_Bool)(*(byte *)(cs[1].tb_jmp_cache + 0x18e) & 1);
  }
  iVar1 = get_physical_address
                    ((CPURISCVState_conflict1 *)(cs[1].tb_jmp_cache + 0x143),&phys_addr,&prot,addr,0
                     ,iVar2,true,two_stage);
  hVar3 = 0xffffffffffffffff;
  if ((((iVar1 == 0) && (hVar3 = phys_addr, ((ulong)cs[1].tb_jmp_cache[0x18a] & 0x80) != 0)) &&
      (((ulong)cs[1].tb_jmp_cache[0x18e] & 1) != 0)) &&
     (iVar2 = get_physical_address
                        ((CPURISCVState_conflict1 *)(cs[1].tb_jmp_cache + 0x143),&phys_addr,&prot,
                         phys_addr,0,iVar2,false,true), hVar3 = phys_addr, iVar2 != 0)) {
    return 0xffffffffffffffff;
  }
  return hVar3;
}

Assistant:

hwaddr riscv_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    RISCVCPU *cpu = RISCV_CPU(cs);
    CPURISCVState *env = &cpu->env;
    hwaddr phys_addr;
    int prot;
    int mmu_idx = cpu_mmu_index(&cpu->env, false);

    if (get_physical_address(env, &phys_addr, &prot, addr, 0, mmu_idx,
                             true, riscv_cpu_virt_enabled(env))) {
        return -1;
    }

    if (riscv_cpu_virt_enabled(env)) {
        if (get_physical_address(env, &phys_addr, &prot, phys_addr,
                                 0, mmu_idx, false, true)) {
            return -1;
        }
    }

    return phys_addr;
}